

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaCl.c
# Opt level: O0

uint32_t Hacl_SecretBox_ZeroPad_crypto_secretbox_open_detached
                   (uint8_t *m,uint8_t *c,uint8_t *mac,uint64_t clen,uint8_t *n1,uint8_t *k1)

{
  uint8_t uVar1;
  uint32_t uVar2;
  uint32_t z;
  uint8_t verify;
  uint8_t result;
  uint8_t *cmac;
  uint8_t *mackey_;
  uint8_t *mackey;
  uint8_t *subkey;
  uint8_t tmp [112];
  uint8_t *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  uint8_t *k;
  uint8_t *output;
  uint8_t *plain;
  uint8_t *output_00;
  uint8_t local_a8 [32];
  uint8_t auStack_88 [32];
  uint8_t auStack_68 [32];
  uint8_t auStack_48 [72];
  
  memset(local_a8,0,0x70);
  output_00 = local_a8;
  plain = auStack_88;
  output = auStack_68;
  k = auStack_48;
  Hacl_Salsa20_hsalsa20
            ((uint8_t *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,
                               CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))),
             in_stack_ffffffffffffff28,(uint8_t *)0x11ab56);
  Hacl_Salsa20_salsa20
            (output_00,plain,(uint32_t)((ulong)output >> 0x20),k,
             (uint8_t *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,
                               CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))),
             (uint64_t)in_stack_ffffffffffffff28);
  Hacl_Poly1305_64_crypto_onetimeauth
            (output,k,CONCAT17(in_stack_ffffffffffffff37,
                               CONCAT16(in_stack_ffffffffffffff36,
                                        CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ))),in_stack_ffffffffffffff28);
  uVar1 = Hacl_Policies_cmp_bytes
                    ((uint8_t *)
                     CONCAT17(in_stack_ffffffffffffff37,
                              CONCAT16(in_stack_ffffffffffffff36,
                                       CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                                      )),in_stack_ffffffffffffff28,0);
  uVar2 = Hacl_SecretBox_ZeroPad_crypto_secretbox_open_detached_decrypt
                    (plain,output,(uint64_t)k,
                     (uint8_t *)
                     CONCAT17(uVar1,CONCAT16(uVar1,CONCAT24(in_stack_ffffffffffffff34,
                                                            in_stack_ffffffffffffff30))),
                     in_stack_ffffffffffffff28,'\0');
  return uVar2;
}

Assistant:

static uint32_t
Hacl_SecretBox_ZeroPad_crypto_secretbox_open_detached(
  uint8_t *m,
  uint8_t *c,
  uint8_t *mac,
  uint64_t clen,
  uint8_t *n1,
  uint8_t *k1
)
{
  uint8_t tmp[112U] = { 0U };
  uint8_t *subkey = tmp;
  uint8_t *mackey = tmp + (uint32_t)32U;
  uint8_t *mackey_ = tmp + (uint32_t)64U;
  uint8_t *cmac = tmp + (uint32_t)96U;
  Hacl_Salsa20_hsalsa20(subkey, k1, n1);
  Hacl_Salsa20_salsa20(mackey, mackey_, (uint32_t)32U, subkey, n1 + (uint32_t)16U, (uint64_t)0U);
  Hacl_Poly1305_64_crypto_onetimeauth(cmac, c + (uint32_t)32U, clen, mackey);
  uint8_t result = Hacl_Policies_cmp_bytes(mac, cmac, (uint32_t)16U);
  uint8_t verify = result;
  uint32_t
  z =
    Hacl_SecretBox_ZeroPad_crypto_secretbox_open_detached_decrypt(m,
      c,
      clen,
      n1,
      subkey,
      verify);
  return z;
}